

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

char * __thiscall mp::BasicConstraintKeeper::GetShortTypeName(BasicConstraintKeeper *this)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  undefined4 extraout_var;
  size_type sVar4;
  string *__range2;
  char cVar5;
  allocator<char> aaStack_68 [32];
  string acc_opt;
  
  if ((this->type_name_short_)._M_string_length == 0) {
    iVar3 = (*this->_vptr_BasicConstraintKeeper[0x1b])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&acc_opt,(char *)CONCAT44(extraout_var,iVar3),aaStack_68);
    cVar5 = (char)&acc_opt;
    std::__cxx11::string::find(cVar5,0x20);
    std::__cxx11::string::find(cVar5,0x3a);
    std::__cxx11::string::substr((ulong)aaStack_68,(ulong)&acc_opt);
    std::__cxx11::string::operator=((string *)&this->type_name_short_,(string *)aaStack_68);
    std::__cxx11::string::~string((string *)aaStack_68);
    pcVar1 = (this->type_name_short_)._M_dataplus._M_p;
    sVar2 = (this->type_name_short_)._M_string_length;
    for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
      if (pcVar1[sVar4] == ':') {
        pcVar1[sVar4] = '_';
      }
    }
    std::__cxx11::string::~string((string *)&acc_opt);
  }
  return (this->type_name_short_)._M_dataplus._M_p;
}

Assistant:

const char*
BasicConstraintKeeper::GetShortTypeName() const {
  if (type_name_short_.empty()) {
    std::string acc_opt = GetAcceptanceOptionNames();
    assert(acc_opt.size());
    auto word_end = std::min(acc_opt.find(' '),
                             acc_opt.size());
    auto colon_pos = acc_opt.find(':');
    if (colon_pos>word_end)
      colon_pos = 0;
    type_name_short_ = acc_opt.substr(
        colon_pos, word_end-colon_pos);
    for (auto& c: type_name_short_)
      if (':'==c)
        c = '_';                // Markdown
    assert(type_name_short_.size());
  }
  return type_name_short_.c_str();
}